

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::writeLocalModel(Highs *this,HighsModel *model,string *filename)

{
  HighsSparseMatrix *this_00;
  HighsLogOptions *log_options;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_01;
  pointer pcVar1;
  bool bVar2;
  HighsStatus HVar3;
  int iVar4;
  Filereader *pFVar5;
  char *format;
  string local_118;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  string local_d8;
  string local_b8;
  HighsLogOptions local_98;
  
  HighsLp::setMatrixDimensions(&model->lp_);
  this_00 = &(model->lp_).a_matrix_;
  HighsSparseMatrix::ensureColwise(this_00);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"writeLocalModel","");
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar2 = lpDimensionsOk(&local_b8,&model->lp_,log_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (!bVar2) {
    return kError;
  }
  if ((0 < (model->hessian_).dim_) &&
     (HVar3 = assessHessianDimensions(&this->options_,&model->hessian_), HVar3 == kError)) {
    return kError;
  }
  HVar3 = HighsSparseMatrix::assessStart(this_00,log_options);
  if (HVar3 == kError) {
    return kError;
  }
  HVar3 = HighsSparseMatrix::assessIndexBounds(this_00,log_options);
  if (HVar3 == kError) {
    return kError;
  }
  bVar2 = HighsNameHash::hasDuplicate(&(model->lp_).col_hash_,&(model->lp_).col_names_);
  if (bVar2) {
    format = "Model has repeated column names\n";
  }
  else {
    bVar2 = HighsNameHash::hasDuplicate(&(model->lp_).row_hash_,&(model->lp_).row_names_);
    if (!bVar2) {
      iVar4 = std::__cxx11::string::compare((char *)filename);
      if (iVar4 == 0) {
        reportModel(this,model);
        HVar3 = kOk;
      }
      else {
        pcVar1 = (filename->_M_dataplus)._M_p;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,pcVar1 + filename->_M_string_length);
        pFVar5 = Filereader::getFilereader(log_options,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        pcVar1 = (filename->_M_dataplus)._M_p;
        if (pFVar5 == (Filereader *)0x0) {
          HVar3 = kOk;
          highsLogUser(log_options,kError,"Model file %s not supported\n",pcVar1);
        }
        else {
          highsLogUser(log_options,kInfo,"Writing the model to %s\n",pcVar1);
          local_98.log_stream = log_options->log_stream;
          local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
          local_98.log_to_console =
               (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
          local_98.log_dev_level =
               (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
          local_98.user_log_callback =
               (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
          local_98.user_log_callback_data =
               (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
          this_01 = &local_98.user_callback;
          std::
          function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
          ::function(this_01,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
          local_98.user_callback_active =
               (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
          local_98.user_callback_data =
               (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
          pcVar1 = (filename->_M_dataplus)._M_p;
          local_f8[0] = local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,pcVar1,pcVar1 + filename->_M_string_length);
          HVar3 = (*pFVar5->_vptr_Filereader[1])(pFVar5,&this->options_,local_f8,model);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"writeModelToFile","");
          HVar3 = interpretCallStatus(&local_98,HVar3,kOk,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_98.user_callback.super__Function_base._M_manager)
                      ((_Any_data *)this_01,(_Any_data *)this_01,__destroy_functor);
          }
          (*pFVar5->_vptr_Filereader[3])(pFVar5);
        }
        if (pFVar5 == (Filereader *)0x0) {
          return kError;
        }
      }
      goto LAB_0020b0d1;
    }
    format = "Model has repeated row names\n";
  }
  highsLogUser(log_options,kError,format);
  HVar3 = kError;
LAB_0020b0d1:
  HVar3 = returnFromHighs(this,HVar3);
  return HVar3;
}

Assistant:

HighsStatus Highs::writeLocalModel(HighsModel& model,
                                   const std::string& filename) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;

  HighsLp& lp = model.lp_;
  // Dimensions in a_matrix_ may not be set, so take them from lp
  lp.setMatrixDimensions();

  // Ensure that the LP is column-wise
  lp.ensureColwise();

  // Ensure that the dimensions are OK
  if (!lpDimensionsOk("writeLocalModel", lp, options_.log_options))
    return HighsStatus::kError;

  if (model.hessian_.dim_ > 0) {
    call_status = assessHessianDimensions(options_, model.hessian_);
    if (call_status == HighsStatus::kError) return call_status;
  }

  // Check that the matrix starts are OK
  call_status = lp.a_matrix_.assessStart(options_.log_options);
  if (call_status == HighsStatus::kError) return call_status;

  // Check that the matrix indices are within bounds
  call_status = lp.a_matrix_.assessIndexBounds(options_.log_options);
  if (call_status == HighsStatus::kError) return call_status;

  // Check for repeated column or row names that would corrupt the file
  if (model.lp_.col_hash_.hasDuplicate(model.lp_.col_names_)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has repeated column names\n");
    return returnFromHighs(HighsStatus::kError);
  }
  if (model.lp_.row_hash_.hasDuplicate(model.lp_.row_names_)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has repeated row names\n");
    return returnFromHighs(HighsStatus::kError);
  }
  if (filename == "") {
    // Empty file name: report model on logging stream
    reportModel(model);
    return_status = HighsStatus::kOk;
  } else {
    Filereader* writer =
        Filereader::getFilereader(options_.log_options, filename);
    if (writer == NULL) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Model file %s not supported\n", filename.c_str());
      return HighsStatus::kError;
    }
    // Report to user that model is being written
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the model to %s\n", filename.c_str());
    return_status =
        interpretCallStatus(options_.log_options,
                            writer->writeModelToFile(options_, filename, model),
                            return_status, "writeModelToFile");
    delete writer;
  }
  return returnFromHighs(return_status);
}